

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O0

void __thiscall Movegen::generate<(Movetype)14,(Piece)2>(Movegen *this)

{
  int local_3c;
  ulong local_38;
  U64 c;
  ulong local_28;
  U64 q;
  U64 mvs;
  Square *s;
  Movegen *this_local;
  
  s = (Square *)this;
  for (mvs = (U64)this->bishops; *(int *)mvs != 0x41; mvs = mvs + 4) {
    q = magics::attacks<(Piece)2>(&this->all_pieces,(Square *)mvs);
    local_28 = q & this->qtarget;
    if (local_28 != 0) {
      c._4_4_ = *(undefined4 *)mvs;
      encode<(Movetype)10>(this,&local_28,(int *)((long)&c + 4));
    }
    local_38 = q & this->ctarget;
    if (local_38 != 0) {
      local_3c = *(int *)mvs;
      encode<(Movetype)11>(this,&local_38,&local_3c);
    }
  }
  return;
}

Assistant:

inline void Movegen::generate<pseudo_legal, bishop>() {
	for (Square* s = &bishops[0]; *s != no_square; ++s) {
		U64 mvs = magics::attacks<bishop>(all_pieces, *s);

		U64 q = mvs & qtarget;
		if (q != 0ULL) encode<quiet>(q, *s);

		U64 c = mvs & ctarget;
		if (c != 0ULL) encode<capture>(c, *s);
	}
}